

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Kirkwood.cpp
# Opt level: O3

void __thiscall OpenMD::Kirkwood::collectHistogram(Kirkwood *this,StuntDouble *sd1,StuntDouble *sd2)

{
  double *pdVar1;
  char cVar2;
  uint uVar3;
  pointer pdVar4;
  bool bVar5;
  uint i_1;
  uint i;
  long lVar6;
  uint uVar7;
  ulong uVar8;
  double tmp;
  double tmp_3;
  double dVar9;
  Vector3d d1;
  Vector3d d2;
  MultipoleAdapter ma2;
  Vector3d r12;
  Vector3d pos2;
  Vector3d pos1;
  MultipoleAdapter ma1;
  double local_b8 [4];
  double local_98 [3];
  MultipoleAdapter local_80;
  Vector3d local_78;
  double local_58 [4];
  double local_38 [3];
  MultipoleAdapter local_20;
  
  if (sd1 != sd2) {
    cVar2 = (((this->super_RadialDistrFunc).super_StaticAnalyser.info_)->simParams_->
            UsePeriodicBoundaryConditions).super_ParameterBase.field_0x2b;
    lVar6 = *(long *)((long)&(sd1->snapshotMan_->currentSnapshot_->atomData).position.
                             super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + sd1->storage_);
    local_38[2] = (double)*(undefined8 *)(lVar6 + 0x10 + (long)sd1->localIndex_ * 0x18);
    pdVar1 = (double *)(lVar6 + (long)sd1->localIndex_ * 0x18);
    local_38[0] = *pdVar1;
    local_38[1] = pdVar1[1];
    lVar6 = *(long *)((long)&(sd2->snapshotMan_->currentSnapshot_->atomData).position.
                             super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + sd2->storage_);
    local_58[2] = (double)*(undefined8 *)(lVar6 + 0x10 + (long)sd2->localIndex_ * 0x18);
    pdVar1 = (double *)(lVar6 + (long)sd2->localIndex_ * 0x18);
    local_58[0] = *pdVar1;
    local_58[1] = pdVar1[1];
    local_b8[0] = 0.0;
    local_b8[1] = 0.0;
    local_b8[2] = 0.0;
    lVar6 = 0;
    do {
      local_b8[lVar6] = local_58[lVar6] - local_38[lVar6];
      lVar6 = lVar6 + 1;
    } while (lVar6 != 3);
    local_78.super_Vector<double,_3U>.data_[2] = local_b8[2];
    local_78.super_Vector<double,_3U>.data_[0] = local_b8[0];
    local_78.super_Vector<double,_3U>.data_[1] = local_b8[1];
    if (cVar2 != '\0') {
      Snapshot::wrapVector((this->super_RadialDistrFunc).currentSnapshot_,&local_78);
    }
    local_b8[3] = 0.0;
    lVar6 = 0;
    do {
      dVar9 = local_78.super_Vector<double,_3U>.data_[lVar6];
      local_b8[3] = local_b8[3] + dVar9 * dVar9;
      lVar6 = lVar6 + 1;
    } while (lVar6 != 3);
    if (local_b8[3] < 0.0) {
      local_b8[3] = sqrt(local_b8[3]);
    }
    else {
      local_b8[3] = SQRT(local_b8[3]);
    }
    local_20.at_ = (AtomType *)sd1[1]._vptr_StuntDouble;
    local_80.at_ = (AtomType *)sd2[1]._vptr_StuntDouble;
    bVar5 = MultipoleAdapter::isDipole(&local_20);
    dVar9 = 0.0;
    if (bVar5) {
      lVar6 = *(long *)((long)&(sd1->snapshotMan_->currentSnapshot_->atomData).dipole.
                               super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + sd1->storage_);
      local_b8[2] = (double)*(undefined8 *)(lVar6 + 0x10 + (long)sd1->localIndex_ * 0x18);
      pdVar1 = (double *)(lVar6 + (long)sd1->localIndex_ * 0x18);
      local_b8[0] = *pdVar1;
      local_b8[1] = pdVar1[1];
      dVar9 = 0.0;
      lVar6 = 0;
      do {
        dVar9 = dVar9 + local_b8[lVar6] * local_b8[lVar6];
        lVar6 = lVar6 + 1;
      } while (lVar6 != 3);
      if (dVar9 < 0.0) {
        dVar9 = sqrt(dVar9);
      }
      else {
        dVar9 = SQRT(dVar9);
      }
      lVar6 = 0;
      do {
        local_b8[lVar6] = local_b8[lVar6] / dVar9;
        lVar6 = lVar6 + 1;
      } while (lVar6 != 3);
      bVar5 = MultipoleAdapter::isDipole(&local_80);
      dVar9 = 0.0;
      if (bVar5) {
        lVar6 = *(long *)((long)&(sd2->snapshotMan_->currentSnapshot_->atomData).dipole.
                                 super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + sd2->storage_);
        local_98[2] = (double)*(undefined8 *)(lVar6 + 0x10 + (long)sd2->localIndex_ * 0x18);
        pdVar1 = (double *)(lVar6 + (long)sd2->localIndex_ * 0x18);
        local_98[0] = *pdVar1;
        local_98[1] = pdVar1[1];
        dVar9 = 0.0;
        lVar6 = 0;
        do {
          dVar9 = dVar9 + local_98[lVar6] * local_98[lVar6];
          lVar6 = lVar6 + 1;
        } while (lVar6 != 3);
        if (dVar9 < 0.0) {
          dVar9 = sqrt(dVar9);
        }
        else {
          dVar9 = SQRT(dVar9);
        }
        lVar6 = 0;
        do {
          local_98[lVar6] = local_98[lVar6] / dVar9;
          lVar6 = lVar6 + 1;
        } while (lVar6 != 3);
        dVar9 = 0.0;
        lVar6 = 0;
        do {
          dVar9 = dVar9 + local_b8[lVar6] * local_98[lVar6];
          lVar6 = lVar6 + 1;
        } while (lVar6 != 3);
      }
    }
    if (local_b8[3] < this->len_) {
      uVar7 = (uint)(local_b8[3] / this->deltaR_);
      uVar3 = (this->super_RadialDistrFunc).super_StaticAnalyser.nBins_;
      if (uVar7 < uVar3) {
        pdVar4 = (this->histogram_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar8 = (ulong)uVar7;
        do {
          pdVar4[uVar8] = pdVar4[uVar8] + dVar9;
          uVar8 = uVar8 + 1;
        } while (uVar3 != uVar8);
      }
    }
  }
  return;
}

Assistant:

void Kirkwood::collectHistogram(StuntDouble* sd1, StuntDouble* sd2) {
    if (sd1 == sd2) { return; }
    bool usePeriodicBoundaryConditions_ =
        info_->getSimParams()->getUsePeriodicBoundaryConditions();

    Vector3d pos1 = sd1->getPos();
    Vector3d pos2 = sd2->getPos();
    Vector3d r12  = pos2 - pos1;
    if (usePeriodicBoundaryConditions_) currentSnapshot_->wrapVector(r12);

    RealType distance = r12.length();

    AtomType* atype1 = static_cast<Atom*>(sd1)->getAtomType();
    AtomType* atype2 = static_cast<Atom*>(sd2)->getAtomType();

    MultipoleAdapter ma1 = MultipoleAdapter(atype1);
    MultipoleAdapter ma2 = MultipoleAdapter(atype2);

    Vector3d d1(0.0);
    Vector3d d2(0.0);
    RealType dotProduct(0.0);

    if (ma1.isDipole()) {
      d1 = sd1->getDipole();
      d1.normalize();
      if (ma2.isDipole()) {
        d2 = sd2->getDipole();
        d2.normalize();
        dotProduct = dot(d1, d2);
      }
    }

    if (distance < len_) {
      int whichBin = int(distance / deltaR_);
      // each dipole pair contributes to all of the radii that contain it.
      for (unsigned int i = whichBin; i < nBins_; i++) {
        histogram_[i] += dotProduct;
      }
    }
  }